

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  ulong *puVar20;
  uint uVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong uVar10;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar15 = (ulong)mlCodeTable[nbSeq - 1];
  uVar2 = (ushort)*CTable_MatchLength;
  lVar19 = (long)(1 << (uVar2 - 1 & 0x1f));
  if (uVar2 == 0) {
    lVar19 = 1;
  }
  uVar3 = (ushort)*CTable_OffsetBits;
  lVar22 = (long)(1 << (uVar3 - 1 & 0x1f));
  if (uVar3 == 0) {
    lVar22 = 1;
  }
  uVar26 = (ulong)llCodeTable[nbSeq - 1];
  uVar4 = (ushort)*CTable_LitLength;
  lVar6 = (long)(1 << (uVar4 - 1 & 0x1f));
  if (uVar4 == 0) {
    lVar6 = 1;
  }
  uVar5 = LL_bits[uVar26];
  uVar9 = ML_bits[uVar15] + uVar5;
  uVar10 = (ulong)uVar9;
  if (0x3f < uVar9) goto LAB_001130cd;
  uVar12 = CTable_MatchLength[lVar19 + uVar15 * 2 + 2] + 0x8000;
  local_a8 = (ulong)*(ushort *)
                     ((long)CTable_MatchLength +
                     (long)(int)CTable_MatchLength[lVar19 + uVar15 * 2 + 1] * 2 +
                     (ulong)((uVar12 & 0xffff0000) - CTable_MatchLength[lVar19 + uVar15 * 2 + 2] >>
                            ((ulong)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar13 = (ulong)bVar1;
  uVar12 = CTable_OffsetBits[lVar22 + uVar13 * 2 + 2] + 0x8000;
  local_a0 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar22 + uVar13 * 2 + 1] * 2 +
                     (ulong)((uVar12 & 0xffff0000) - CTable_OffsetBits[lVar22 + uVar13 * 2 + 2] >>
                            ((ulong)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
  uVar12 = CTable_LitLength[lVar6 + uVar26 * 2 + 2] + 0x8000;
  local_b0 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar6 + uVar26 * 2 + 1] * 2 +
                     (ulong)((uVar12 & 0xffff0000) - CTable_LitLength[lVar6 + uVar26 * 2 + 2] >>
                            ((ulong)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
  uVar15 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar15]]) <<
           ((ulong)uVar5 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar5]);
  puVar23 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar16 = (ulong *)dst;
  if (longOffsets == 0) {
    if (0x1f < bVar1) goto LAB_001130ec;
    uVar9 = uVar9 + bVar1;
    if (0x3f < uVar9) goto LAB_001130cd;
    uVar5 = sequences[nbSeq - 1].offset;
  }
  else {
    uVar12 = 0x38;
    if (bVar1 < 0x38) {
      uVar12 = (uint)bVar1;
    }
    uVar5 = bVar1 - uVar12;
    if (0x38 < bVar1) {
      if (0x1f < uVar5) goto LAB_001130ec;
      uVar9 = uVar9 + uVar5;
      if (0x3f < uVar9) goto LAB_001130cd;
      if (puVar23 < dst) goto LAB_0011310b;
      uVar15 = (ulong)(sequences[nbSeq - 1].offset & BIT_mask[uVar5]) << (uVar10 & 0x3f) | uVar15;
      *(ulong *)dst = uVar15;
      puVar16 = (ulong *)((ulong)(uVar9 >> 3) + (long)dst);
      if (puVar23 < puVar16) {
        puVar16 = puVar23;
      }
      uVar10 = (ulong)(uVar9 & 7);
      uVar15 = uVar15 >> ((ulong)((byte)uVar9 & 0xf8) & 0x3f);
    }
    if (0x1f < bVar1) goto LAB_001130ec;
    uVar9 = (int)uVar10 + uVar12;
    if (0x3f < uVar9) goto LAB_001130cd;
    uVar5 = sequences[nbSeq - 1].offset >> (uVar5 & 0x1f);
    uVar13 = (ulong)uVar12;
  }
  if (puVar23 < puVar16) {
LAB_0011310b:
    __assert_fail("bitC->ptr <= bitC->endPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
  }
  uVar15 = (ulong)(uVar5 & BIT_mask[uVar13]) << (uVar10 & 0x3f) | uVar15;
  *puVar16 = uVar15;
  puVar16 = (ulong *)((ulong)(uVar9 >> 3) + (long)puVar16);
  if (puVar23 < puVar16) {
    puVar16 = puVar23;
  }
  uVar15 = uVar15 >> ((ulong)((byte)uVar9 & 0xf8) & 0x3f);
  uVar9 = uVar9 & 7;
  if (1 < nbSeq) {
    uVar26 = nbSeq - 2;
    do {
      bVar1 = ofCodeTable[uVar26];
      uVar10 = (ulong)bVar1;
      uVar13 = CTable_OffsetBits[lVar22 + uVar10 * 2 + 2] + local_a0;
      if (0x1fffff < uVar13) goto LAB_001130ec;
      uVar5 = uVar9 + (int)(uVar13 >> 0x10);
      if (0x3f < uVar5) goto LAB_001130cd;
      uVar7 = (ulong)mlCodeTable[uVar26];
      uVar11 = CTable_MatchLength[lVar19 + uVar7 * 2 + 2] + local_a8;
      if (0x1fffff < uVar11) goto LAB_001130ec;
      uVar12 = uVar5 + (int)(uVar11 >> 0x10);
      if (0x3f < uVar12) goto LAB_001130cd;
      uVar25 = (ulong)llCodeTable[uVar26];
      uVar24 = CTable_LitLength[lVar6 + uVar25 * 2 + 2] + local_b0;
      if (0x1fffff < uVar24) goto LAB_001130ec;
      uVar14 = (int)(uVar24 >> 0x10) + uVar12;
      if (0x3f < uVar14) goto LAB_001130cd;
      uVar21 = (uint)local_a0;
      local_a0 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar22 + uVar10 * 2 + 1] * 2 +
                         (local_a0 >> (uVar13 >> 0x10 & 0x3f)) * 2 + 4);
      uVar18 = (uint)local_a8;
      local_a8 = (ulong)*(ushort *)
                         ((long)CTable_MatchLength +
                         (long)(int)CTable_MatchLength[lVar19 + uVar7 * 2 + 1] * 2 +
                         (local_a8 >> (uVar11 >> 0x10 & 0x3f)) * 2 + 4);
      uVar15 = (ulong)(BIT_mask[uVar24 >> 0x10] & (uint)local_b0) << ((ulong)uVar12 & 0x3f) |
               (ulong)(BIT_mask[uVar11 >> 0x10] & uVar18) << ((ulong)uVar5 & 0x3f) |
               (ulong)(BIT_mask[uVar13 >> 0x10] & uVar21) << uVar9 | uVar15;
      uVar5 = LL_bits[uVar25];
      uVar9 = ML_bits[uVar7];
      local_b0 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar6 + uVar25 * 2 + 1] * 2 +
                         (local_b0 >> (uVar24 >> 0x10 & 0x3f)) * 2 + 4);
      uVar12 = uVar5 + bVar1 + uVar9;
      if (0x1e < uVar12) {
        *puVar16 = uVar15;
        puVar20 = (ulong *)((ulong)(uVar14 >> 3) + (long)puVar16);
        puVar16 = puVar23;
        if (puVar20 <= puVar23) {
          puVar16 = puVar20;
        }
        uVar15 = uVar15 >> ((ulong)((byte)uVar14 & 0xf8) & 0x3f);
        uVar14 = uVar14 & 7;
      }
      uVar18 = uVar5 + uVar14;
      if ((0x3f < uVar18) || (uVar21 = uVar18 + uVar9, 0x3f < uVar21)) goto LAB_001130cd;
      uVar15 = (ulong)((uint)sequences[uVar26].matchLength & BIT_mask[uVar9]) <<
               ((ulong)uVar18 & 0x3f) |
               (ulong)((uint)sequences[uVar26].litLength & BIT_mask[uVar5]) <<
               ((ulong)uVar14 & 0x3f) | uVar15;
      uVar9 = uVar21;
      if (0x38 < uVar12) {
        *puVar16 = uVar15;
        puVar20 = (ulong *)((ulong)(uVar21 >> 3) + (long)puVar16);
        puVar16 = puVar23;
        if (puVar20 <= puVar23) {
          puVar16 = puVar20;
        }
        uVar9 = uVar21 & 7;
        uVar15 = uVar15 >> ((ulong)((byte)uVar21 & 0xf8) & 0x3f);
      }
      uVar13 = (ulong)uVar9;
      if (longOffsets == 0) {
        if (0x1f < bVar1) goto LAB_001130ec;
        uVar9 = uVar9 + bVar1;
        if (0x3f < uVar9) goto LAB_001130cd;
        uVar5 = sequences[uVar26].offset;
      }
      else {
        uVar7 = 0x38;
        if (bVar1 < 0x38) {
          uVar7 = uVar10;
        }
        uVar5 = (uint)bVar1 - (int)uVar7;
        if (0x38 < bVar1) {
          if (0x1f < uVar5) goto LAB_001130ec;
          uVar9 = uVar9 + uVar5;
          if (0x3f < uVar9) goto LAB_001130cd;
          uVar15 = (ulong)(sequences[uVar26].offset & BIT_mask[uVar5]) << (uVar13 & 0x3f) | uVar15;
          *puVar16 = uVar15;
          puVar20 = (ulong *)((ulong)(uVar9 >> 3) + (long)puVar16);
          puVar16 = puVar23;
          if (puVar20 <= puVar23) {
            puVar16 = puVar20;
          }
          uVar13 = (ulong)(uVar9 & 7);
          uVar15 = uVar15 >> ((ulong)((byte)uVar9 & 0xf8) & 0x3f);
        }
        if (0x1f < bVar1) goto LAB_001130ec;
        uVar9 = (int)uVar13 + (int)uVar7;
        if (0x3f < uVar9) goto LAB_001130cd;
        uVar5 = sequences[uVar26].offset >> (uVar5 & 0x1f);
        uVar10 = uVar7;
      }
      if (puVar23 < puVar16) goto LAB_0011310b;
      uVar15 = (ulong)(uVar5 & BIT_mask[uVar10]) << (uVar13 & 0x3f) | uVar15;
      *puVar16 = uVar15;
      puVar20 = (ulong *)((ulong)(uVar9 >> 3) + (long)puVar16);
      puVar16 = puVar23;
      if (puVar20 <= puVar23) {
        puVar16 = puVar20;
      }
      uVar15 = uVar15 >> ((ulong)((byte)uVar9 & 0xf8) & 0x3f);
      uVar26 = uVar26 - 1;
      uVar9 = uVar9 & 7;
    } while (uVar26 < nbSeq);
  }
  if (uVar2 < 0x20) {
    uVar5 = uVar9 + uVar2;
    if (uVar5 < 0x40) {
      uVar15 = (ulong)((uint)local_a8 & BIT_mask[uVar2]) << uVar9 | uVar15;
      *puVar16 = uVar15;
      puVar16 = (ulong *)((ulong)(uVar5 >> 3) + (long)puVar16);
      if (puVar23 < puVar16) {
        puVar16 = puVar23;
      }
      if (0x1f < uVar3) goto LAB_001130ec;
      uVar9 = (uVar5 & 7) + (uint)uVar3;
      if (uVar9 < 0x40) {
        uVar15 = (ulong)((uint)local_a0 & BIT_mask[uVar3]) << (uVar5 & 7) |
                 uVar15 >> ((ulong)((byte)uVar5 & 0xf8) & 0x3f);
        *puVar16 = uVar15;
        puVar16 = (ulong *)((ulong)(uVar9 >> 3) + (long)puVar16);
        if (puVar23 < puVar16) {
          puVar16 = puVar23;
        }
        if (0x1f < uVar4) goto LAB_001130ec;
        uVar5 = (uVar9 & 7) + (uint)uVar4;
        if (uVar5 < 0x40) {
          uVar15 = (ulong)((uint)local_b0 & BIT_mask[uVar4]) << (uVar9 & 7) |
                   uVar15 >> ((ulong)((byte)uVar9 & 0xf8) & 0x3f);
          uVar9 = (uVar5 & 7) + 1;
          puVar20 = (ulong *)((ulong)(uVar5 >> 3) + (long)puVar16);
          if (puVar23 < puVar20) {
            puVar20 = puVar23;
          }
          puVar17 = (ulong *)((ulong)(uVar9 >> 3) + (long)puVar20);
          if (puVar23 < puVar17) {
            puVar17 = puVar23;
          }
          *puVar16 = uVar15;
          *puVar20 = uVar15 >> ((ulong)((byte)uVar5 & 0xf8) & 0x3f) | 1L << (uVar5 & 7);
          sVar8 = 0;
          if (puVar17 < puVar23) {
            sVar8 = (long)puVar17 - ((long)dst + ((ulong)((uVar9 & 7) == 0) - 1));
          }
          if (sVar8 == 0) {
            return 0xffffffffffffffba;
          }
          return sVar8;
        }
      }
    }
LAB_001130cd:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_001130ec:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}